

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O1

char * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::alloc
          (Allocator<mecab_node_t,_mecab_path_t> *this,size_t size)

{
  ChunkFreeList<char> *pCVar1;
  char *pcVar2;
  
  if ((this->char_freelist_).ptr_ == (ChunkFreeList<char> *)0x0) {
    pCVar1 = (ChunkFreeList<char> *)operator_new(0x38);
    pCVar1->_vptr_ChunkFreeList = (_func_int **)&PTR__ChunkFreeList_00172ab8;
    (pCVar1->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar1->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar1->freelist_).
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar1->pi_ = 0;
    pCVar1->li_ = 0;
    pCVar1->default_size = 0x2000;
    (this->char_freelist_).ptr_ = pCVar1;
  }
  pcVar2 = ChunkFreeList<char>::alloc((this->char_freelist_).ptr_,size + 1);
  return pcVar2;
}

Assistant:

char *alloc(size_t size) {
    if (!char_freelist_.get()) {
      char_freelist_.reset(new ChunkFreeList<char>(BUF_SIZE));
    }
    return char_freelist_->alloc(size + 1);
  }